

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.hpp
# Opt level: O1

void czh::utils::grisu2(double v,string *buffer,int *K)

{
  long lVar1;
  double dVar2;
  int iVar3;
  uint64_t significand;
  ulong uVar4;
  int biased_e;
  uint uVar5;
  DiyFp DVar6;
  DiyFp DVar7;
  DiyFp W;
  DiyFp Mp;
  DiyFp local_90;
  tuple<czh::utils::DiyFp,_czh::utils::DiyFp> local_80;
  DiyFp local_60;
  DiyFp local_50;
  DiyFp local_40;
  
  uVar4 = (ulong)v & 0xfffffffffffff;
  uVar5 = (uint)((ulong)v >> 0x34) & 0x7ff;
  if (uVar5 == 0) {
    local_90.e = -0x432;
    local_90.f = uVar4;
  }
  else {
    local_90.e = uVar5 - 0x433;
    local_90.f = uVar4 | 0x10000000000000;
  }
  DiyFp::normalized_boundaries(&local_80,&local_90);
  local_90.f = uVar4 | 0x10000000000000;
  local_90.e = uVar5 - 0x433;
  if (uVar5 == 0) {
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    local_90.f = uVar4 << (~(byte)lVar1 + 0x35 & 0x3f);
    local_90.e = -0x427 - ((uint)lVar1 ^ 0x3f);
  }
  local_90.f = local_90.f << 0xb;
  local_90.e = local_90.e + -0xb;
  dVar2 = ceil((double)(-0x3c - local_80.
                                super__Tuple_impl<0UL,_czh::utils::DiyFp,_czh::utils::DiyFp>.
                                super__Tuple_impl<1UL,_czh::utils::DiyFp>.
                                super__Head_base<1UL,_czh::utils::DiyFp,_false>._M_head_impl.e) *
               0.30102999566398114);
  iVar3 = (int)dVar2;
  local_40.f = *(uint64_t *)(powers_ten + (long)iVar3 * 8 + 0xab8);
  local_40.e = *(int *)(powers_ten_e + (long)iVar3 * 4 + 0x55c);
  DVar6 = DiyFp::operator*(&local_90,&local_40);
  DVar7 = DiyFp::operator*((DiyFp *)&local_80,&local_40);
  local_50.f = DVar7.f;
  local_50.e = DVar7.e;
  DVar7 = DiyFp::operator*(&local_80.super__Tuple_impl<0UL,_czh::utils::DiyFp,_czh::utils::DiyFp>.
                            super__Head_base<0UL,_czh::utils::DiyFp,_false>._M_head_impl,&local_40);
  local_60.e = DVar7.e;
  local_60.f = DVar7.f + 1;
  local_50.f = local_50.f - 1;
  DVar7 = DiyFp::operator-(&local_50,&local_60);
  *K = -iVar3;
  Mp.e = local_50.e;
  Mp.f = local_50.f;
  W._12_4_ = 0;
  W.f = SUB128(DVar6._0_12_,0);
  W.e = SUB124(DVar6._0_12_,8);
  Mp._12_4_ = 0;
  DVar6._8_8_ = K;
  DVar6.f = DVar7.f;
  digit_gen(W,Mp,DVar6,buffer,K);
  return;
}

Assistant:

void grisu2(double v, std::string &buffer, int &K)
  {
    int q = 64, alpha = -59;
    auto[w_m, w_p] = DiyFp(v).normalized_boundaries();
    DiyFp w = DiyFp(v).normalize();
    int mk = k_comp(w_p.e + q, alpha);
    DiyFp c_mk = cached_power(mk);
    DiyFp W = w * c_mk;
    DiyFp Wp = w_p * c_mk;
    DiyFp Wm = w_m * c_mk;
    Wm.f++;
    Wp.f--;
    DiyFp delta = Wp - Wm;
    K = -mk;
    digit_gen(W, Wp, delta, buffer, K);
  }